

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minMaxFinalize(sqlite3_context *context)

{
  sqlite3_value *pValue;
  sqlite3_value *pRes;
  sqlite3_context *context_local;
  
  pValue = (sqlite3_value *)sqlite3_aggregate_context(context,0);
  if (pValue != (sqlite3_value *)0x0) {
    if (pValue->flags != 0) {
      sqlite3_result_value(context,pValue);
    }
    sqlite3VdbeMemRelease(pValue);
  }
  return;
}

Assistant:

static void minMaxFinalize(sqlite3_context *context){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    sqlite3VdbeMemRelease(pRes);
  }
}